

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfobjs.c
# Opt level: O1

FT_Error sfnt_load_face(FT_Stream stream,TT_Face face,FT_Int face_instance_index,FT_Int num_params,
                       FT_Parameter *params)

{
  FT_String **name;
  FT_String **name_00;
  FT_Long *pFVar1;
  byte bVar2;
  ushort uVar3;
  FT_UShort FVar4;
  short sVar5;
  undefined2 uVar6;
  undefined2 uVar7;
  undefined2 uVar8;
  long lVar9;
  void *pvVar10;
  FT_Incremental_InterfaceRec *pFVar11;
  FT_CharMap *ppFVar12;
  FT_CharMap pFVar13;
  FT_Memory memory;
  short sVar14;
  undefined4 uVar15;
  FT_Error FVar16;
  FT_Error FVar17;
  uint uVar18;
  uint uVar19;
  int iVar20;
  TT_Table entry;
  FT_Face_Internal pFVar21;
  ulong uVar22;
  FT_Bitmap_Size *pFVar23;
  FT_UShort *pFVar24;
  long lVar25;
  FT_Matrix *pFVar26;
  ulong uVar27;
  FT_Face_Internal pFVar28;
  FT_Encoding FVar29;
  int iVar30;
  ulong uVar31;
  ulong uVar32;
  bool bVar33;
  FT_Error error;
  FT_CharMapRec cmaprec;
  uint local_a4;
  uint local_a0;
  uint local_9c;
  undefined8 local_98;
  FT_Bitmap_Size *local_90;
  undefined4 local_88;
  undefined4 local_84;
  ulong local_80;
  FT_Error local_74;
  void *local_70;
  FT_CharMapRec_ local_68 [2];
  uint local_40;
  
  if (num_params < 1) {
    local_88 = 0;
    bVar33 = true;
    local_84 = 0;
  }
  else {
    lVar25 = 0;
    local_84 = 0;
    local_88 = 0;
    bVar33 = false;
    do {
      lVar9 = *(long *)((long)&params->tag + lVar25);
      if (lVar9 == 0x69677066) {
        local_84 = 1;
      }
      else if (lVar9 == 0x69736278) {
        bVar33 = true;
      }
      else if (lVar9 == 0x69677073) {
        local_88 = 1;
      }
      lVar25 = lVar25 + 0x10;
    } while ((ulong)(uint)num_params << 4 != lVar25);
    bVar33 = !bVar33;
  }
  pFVar21 = (face->root).internal;
  if (pFVar21->incremental_interface != (FT_Incremental_InterfaceRec *)0x0) {
    uVar15 = (undefined4)CONCAT71((int7)((ulong)pFVar21 >> 8),1);
    goto LAB_002478e6;
  }
  uVar3 = face->num_tables;
  if (uVar3 != 0) {
    pFVar21 = (FT_Face_Internal)face->dir_tables;
    pFVar26 = &pFVar21->transform_matrix + uVar3;
    pFVar28 = pFVar21;
    do {
      if (((pFVar28->transform_matrix).xx == 0x676c7966) && ((pFVar28->transform_matrix).yy != 0))
      goto LAB_00247b30;
      pFVar28 = (FT_Face_Internal)&pFVar28->transform_delta;
    } while (pFVar28 < pFVar26);
    pFVar28 = pFVar21;
    if (uVar3 != 0) {
      do {
        if (((pFVar28->transform_matrix).xx == 0x43464620) && ((pFVar28->transform_matrix).yy != 0))
        goto LAB_00247b30;
        pFVar28 = (FT_Face_Internal)&pFVar28->transform_delta;
      } while (pFVar28 < pFVar26);
      if (uVar3 != 0) {
        do {
          if (((pFVar21->transform_matrix).xx == 0x43464632) &&
             ((pFVar21->transform_matrix).yy != 0)) goto LAB_00247b30;
          pFVar21 = (FT_Face_Internal)&pFVar21->transform_delta;
        } while (pFVar21 < pFVar26);
      }
    }
  }
  local_98 = (FT_Memory)((ulong)local_98._4_4_ << 0x20);
  local_a0 = (uint)CONCAT71((int7)((ulong)pFVar21 >> 8),1);
LAB_0024799c:
  pvVar10 = face->sfnt;
  FVar16 = (*face->goto_table)(face,0x43424c43,stream,(FT_ULong *)0x0);
  local_90 = (FT_Bitmap_Size *)CONCAT44(local_90._4_4_,FVar16);
  FVar16 = (*face->goto_table)(face,0x43424454,stream,(FT_ULong *)0x0);
  FVar17 = (*face->goto_table)(face,0x45424c43,stream,(FT_ULong *)0x0);
  local_80 = CONCAT44(local_80._4_4_,FVar17);
  local_74 = (*face->goto_table)(face,0x626c6f63,stream,(FT_ULong *)0x0);
  FVar17 = (*face->goto_table)(face,0x73626978,stream,(FT_ULong *)0x0);
  local_9c = CONCAT31(local_9c._1_3_,bVar33 & FVar17 == 0);
  bVar33 = true;
  if (((char)local_a0 != '\0') && (*(code **)((long)pvVar10 + 0x88) != (code *)0x0)) {
    local_a4 = (**(code **)((long)pvVar10 + 0x88))(face,stream);
    bVar33 = local_a4 != 0;
  }
  if ((bVar33 || (local_9c & 1) != 0) &&
     (local_a4 = (**(code **)((long)pvVar10 + 0x30))(face,stream), local_a4 != 0)) {
    return local_a4;
  }
  local_a0 = (uint)(byte)local_98;
  if (FVar16 == 0) {
    local_a0 = 0;
  }
  if ((int)local_90 == 0) {
    local_a0 = 0;
  }
  if ((ushort)((face->header).Units_Per_EM + 0xbfff) < 0xc00f) {
    return 8;
  }
  local_a4 = (**(code **)((long)pvVar10 + 0x48))(face,stream);
  local_a4 = (**(code **)((long)pvVar10 + 0x40))(face,stream);
  local_a4 = (**(code **)((long)pvVar10 + 0x60))(face,stream);
  uVar18 = (**(code **)((long)pvVar10 + 0x58))(face,stream);
  local_a4 = uVar18;
  if (bVar33) {
    local_a4 = (**(code **)((long)pvVar10 + 0x38))(face,stream,0);
    if (local_a4 == 0) {
      local_a4 = (**(code **)((long)pvVar10 + 0xb8))(face,stream,0);
      if ((char)local_a4 == -0x72) {
        local_a4 = 0x93;
LAB_00247b6b:
        pFVar11 = ((face->root).internal)->incremental_interface;
        if ((pFVar11 != (FT_Incremental_InterfaceRec *)0x0) &&
           (pFVar11->funcs->get_glyph_metrics != (FT_Incremental_GetGlyphMetricsFunc)0x0)) {
          (face->horizontal).number_Of_HMetrics = 0;
          local_a4 = 0;
        }
      }
    }
    else if ((char)local_a4 == -0x72) {
      if (face->format_tag != 0x74727565) {
        local_a4 = 0x8f;
        goto LAB_00247b6b;
      }
      local_a4 = 0;
      local_a0 = 0;
    }
    if (local_a4 != 0) {
      return local_a4;
    }
    local_a4 = (**(code **)((long)pvVar10 + 0x38))(face,stream,1);
    if ((local_a4 == 0) &&
       (local_a4 = (**(code **)((long)pvVar10 + 0xb8))(face,stream,1), local_a4 == 0)) {
      face->vertical_info = '\x01';
    }
    if (local_a4 != 0 && (char)local_a4 != -0x72) {
      return local_a4;
    }
    local_a4 = (**(code **)((long)pvVar10 + 0x50))(face,stream);
    if (local_a4 != 0) {
      (face->os2).version = 0xffff;
    }
  }
  if (*(code **)((long)pvVar10 + 0xc0) != (code *)0x0) {
    if ((((int)local_90 == 0 || (int)local_80 == 0) || local_74 == 0) || (local_9c & 1) != 0) {
      local_a4 = (**(code **)((long)pvVar10 + 0xc0))(face,stream);
    }
  }
  if (*(code **)((long)pvVar10 + 0xe0) != (code *)0x0) {
    local_a4 = (**(code **)((long)pvVar10 + 0xe0))(face,stream);
    local_a4 = (**(code **)((long)pvVar10 + 0xe8))(face,stream);
  }
  if (*(code **)((long)pvVar10 + 0x158) != (code *)0x0) {
    local_a4 = (**(code **)((long)pvVar10 + 0x158))(face,stream);
  }
  local_a4 = (**(code **)((long)pvVar10 + 0x80))(face,stream);
  local_a4 = (**(code **)((long)pvVar10 + 0x78))(face,stream);
  local_a4 = (**(code **)((long)pvVar10 + 0x70))(face);
  (face->root).num_glyphs = (ulong)(face->max_profile).numGlyphs;
  name = &(face->root).family_name;
  name_00 = &(face->root).style_name;
  (face->root).family_name = (FT_String *)0x0;
  (face->root).style_name = (FT_String *)0x0;
  if (((face->os2).version == 0xffff) || (((face->os2).fsSelection & 0x100) == 0)) {
    local_a4 = tt_face_get_name(face,0x15,name);
    if (local_a4 != 0) {
      return local_a4;
    }
    uVar19 = 0;
    if (((char)local_84 == '\0' && *name == (FT_String *)0x0) &&
       (uVar19 = tt_face_get_name(face,0x10,name), uVar19 != 0)) {
      return uVar19;
    }
    local_a4 = uVar19;
    if (*name == (FT_String *)0x0) {
      uVar19 = tt_face_get_name(face,1,name);
      if (uVar19 != 0) {
        return uVar19;
      }
      local_a4 = 0;
    }
    uVar19 = tt_face_get_name(face,0x16,name_00);
    if (uVar19 != 0) {
      return uVar19;
    }
    local_a4 = 0;
    uVar19 = 0;
    if ((char)local_88 == '\0' && *name_00 == (FT_String *)0x0) goto LAB_00247d9d;
  }
  else {
    if (((char)local_84 == '\0') && (local_a4 = tt_face_get_name(face,0x10,name), local_a4 != 0)) {
      return local_a4;
    }
    if ((*name == (FT_String *)0x0) && (local_a4 = tt_face_get_name(face,1,name), local_a4 != 0)) {
      return local_a4;
    }
    uVar19 = local_a4;
    if ((char)local_88 == '\0') {
LAB_00247d9d:
      local_a4 = uVar19;
      local_a4 = tt_face_get_name(face,0x11,name_00);
      if (local_a4 != 0) {
        return local_a4;
      }
    }
  }
  if ((*name_00 == (FT_String *)0x0) && (local_a4 = tt_face_get_name(face,2,name_00), local_a4 != 0)
     ) {
    return local_a4;
  }
  uVar22 = (face->root).face_flags;
  if ((((face->sbit_table_type & ~TT_SBIT_TABLE_TYPE_EBLC) == TT_SBIT_TABLE_TYPE_CBLC) ||
      (face->colr != (void *)0x0)) || (face->svg != (void *)0x0)) {
    uVar22 = uVar22 | 0x4000;
  }
  if ((char)local_a0 == '\x01') {
    if ((char)local_9c == '\0') {
      uVar22 = uVar22 | 1;
    }
    else {
      uVar22 = uVar22 | 0x20000;
    }
  }
  uVar31 = uVar22 | 0x18;
  if ((uVar18 == 0) && ((face->postscript).FormatType != 0x30000)) {
    uVar31 = uVar22 | 0x218;
  }
  uVar22 = uVar31 | 4;
  if ((face->postscript).isFixedPitch == 0) {
    uVar22 = uVar31;
  }
  uVar31 = uVar22 | 0x20;
  if (face->vertical_info == '\0') {
    uVar31 = uVar22;
  }
  uVar22 = uVar31 | 0x40;
  if (face->kern_avail_bits == 0) {
    uVar22 = uVar31;
  }
  (face->root).face_flags = (face->variation_support & 1) << 8 | uVar22;
  if (((char)local_a0 == '\x01') && ((face->os2).version != 0xffff)) {
    uVar3 = (face->os2).fsSelection;
    uVar22 = (ulong)((uint)((uVar3 & 0x201) != 0) | uVar3 >> 4 & 2);
  }
  else {
    bVar2 = (byte)(face->header).Mac_Style;
    uVar22 = (ulong)(byte)((bVar2 & 2) >> 1 | bVar2 * '\x02') & 3;
  }
  pFVar1 = &(face->root).style_flags;
  *pFVar1 = *pFVar1 | uVar22;
  local_70 = pvVar10;
  tt_face_build_cmaps(face);
  iVar20 = (face->root).num_charmaps;
  if ((long)iVar20 < 1) {
LAB_00247fd7:
    if (((face->root).face_flags & 0x200) == 0) goto LAB_00248032;
    local_68[0].encoding = FT_ENCODING_UNICODE;
    local_68[0].platform_id = 3;
    local_68[0].encoding_id = 1;
    iVar30 = 0;
    local_68[0].face = &face->root;
    local_a4 = FT_CMap_New(&tt_cmap_unicode_class_rec.clazz,(FT_Pointer)0x0,local_68,
                           (FT_CMap_conflict *)0x0);
    uVar22 = (ulong)local_a4;
    if (((local_a4 == 0) || ((char)local_a4 == -0x5d)) || (uVar22 = 0, (local_a4 & 0xff) == 7)) {
      local_a4 = 0;
      iVar20 = (int)CONCAT71((int7)(uVar22 >> 8),1);
    }
    else {
      iVar30 = 0x1d;
      iVar20 = 0;
    }
    if ((char)iVar20 != '\0') goto LAB_00248032;
  }
  else {
    ppFVar12 = (face->root).charmaps;
    lVar25 = 0;
    bVar33 = false;
    do {
      pFVar13 = ppFVar12[lVar25];
      uVar22 = 0xfffffffffffffff4;
      do {
        if ((*(uint *)((long)&DAT_00309e7c + uVar22) == (uint)pFVar13->platform_id) &&
           ((*(uint *)((long)&DAT_00309e80 + uVar22) == (uint)pFVar13->encoding_id ||
            (*(uint *)((long)&DAT_00309e80 + uVar22) == 0xffffffff)))) {
          FVar29 = *(FT_Encoding *)((long)&DAT_00309e84 + uVar22);
          goto LAB_00247fb1;
        }
        uVar22 = uVar22 + 0xc;
      } while (uVar22 < 0x78);
      FVar29 = FT_ENCODING_NONE;
LAB_00247fb1:
      pFVar13->encoding = FVar29;
      if ((FVar29 == FT_ENCODING_UNICODE) || (FVar29 == FT_ENCODING_MS_SYMBOL)) {
        bVar33 = true;
      }
      lVar25 = lVar25 + 1;
    } while (lVar25 != iVar20);
    if (!bVar33) goto LAB_00247fd7;
LAB_00248032:
    iVar30 = 0;
  }
  if (iVar30 != 0) goto LAB_00248389;
  uVar18 = face->sbit_num_strikes;
  uVar22 = (ulong)uVar18;
  if (uVar22 == 0) {
LAB_00248204:
    iVar30 = 0;
  }
  else {
    memory = ((face->root).stream)->memory;
    FVar4 = (face->header).Units_Per_EM;
    if ((FVar4 == 0) || ((face->os2).version == 0xffff)) {
      local_a0 = CONCAT22(local_a0._2_2_,1);
      local_9c = CONCAT22(local_9c._2_2_,1);
    }
    else {
      local_a0 = CONCAT22(local_a0._2_2_,FVar4);
      local_9c = CONCAT22(local_9c._2_2_,(face->os2).xAvgCharWidth);
    }
    bVar33 = false;
    pFVar23 = (FT_Bitmap_Size *)
              ft_mem_realloc(memory,0x20,0,uVar22,(void *)0x0,(FT_Error *)&local_a4);
    (face->root).available_sizes = pFVar23;
    iVar30 = 0x1d;
    if (local_a4 == 0) {
      pFVar23 = (FT_Bitmap_Size *)
                ft_mem_qrealloc(memory,4,0,uVar22,(void *)0x0,(FT_Error *)&local_a4);
      bVar33 = false;
      if (local_a4 == 0) {
        local_9c = (uint)(short)local_9c;
        uVar19 = local_a0 >> 1;
        uVar31 = 1;
        if (1 < uVar18) {
          uVar31 = (ulong)uVar18;
        }
        uVar27 = 0;
        uVar32 = 0;
        local_a0 = local_a0 & 0xffff;
        local_98 = memory;
        local_90 = pFVar23;
        local_80 = uVar22;
        do {
          pFVar23 = (face->root).available_sizes;
          local_a4 = (**(code **)((long)local_70 + 0xd8))(face,uVar27,local_68);
          uVar22 = uVar32;
          if (local_a4 == 0) {
            pFVar23[uVar32].height = (FT_Short)(local_40 >> 6);
            pFVar23[uVar32].width =
                 (FT_Short)
                 ((int)((ushort)local_68[0].face * local_9c + (uVar19 & 0x7fff)) / (int)local_a0);
            pFVar23[uVar32].x_ppem = ((ulong)local_68[0].face & 0xffff) << 6;
            pFVar23[uVar32].y_ppem = (ulong)local_68[0].face._2_2_ << 6;
            pFVar23[uVar32].size = (ulong)local_68[0].face._2_2_ << 6;
            if (local_68[0].face._2_2_ != 0 && (ushort)local_68[0].face != 0) {
              uVar22 = (ulong)((int)uVar32 + 1);
              *(int *)(&local_90->height + uVar32 * 2) = (int)uVar27;
            }
          }
          uVar27 = uVar27 + 1;
          uVar32 = uVar22;
        } while (uVar31 != uVar27);
        pFVar23 = (FT_Bitmap_Size *)
                  ft_mem_qrealloc(local_98,4,local_80,uVar22,local_90,(FT_Error *)&local_a4);
        iVar30 = 0;
        bVar33 = true;
        if ((int)uVar22 != 0) {
          face->sbit_strike_map = (FT_UInt *)pFVar23;
          pFVar1 = &(face->root).face_flags;
          *(byte *)pFVar1 = (byte)*pFVar1 | 2;
          (face->root).num_fixed_sizes = (int)uVar22;
        }
      }
    }
    iVar20 = (int)pFVar23;
    if (bVar33) goto LAB_00248204;
  }
  if (iVar30 != 0) goto LAB_00248389;
  uVar22 = (face->root).face_flags;
  if ((uVar22 & 3) == 0) {
    uVar22 = uVar22 | 1;
    (face->root).face_flags = uVar22;
  }
  iVar20 = (int)uVar22;
  iVar30 = 0;
  if (((face->root).face_flags & 0x20001) == 0) goto LAB_00248389;
  (face->root).bbox.xMin = (long)(face->header).xMin;
  (face->root).bbox.yMin = (long)(face->header).yMin;
  (face->root).bbox.xMax = (long)(face->header).xMax;
  (face->root).bbox.yMax = (long)(face->header).yMax;
  FVar4 = (face->os2).version;
  (face->root).units_per_EM = (face->header).Units_Per_EM;
  if ((FVar4 == 0xffff) || (((face->os2).fsSelection & 0x80) == 0)) {
    uVar6 = (face->horizontal).Ascender;
    sVar14 = (face->horizontal).Descender;
    sVar5 = (face->horizontal).Line_Gap;
    (face->root).ascender = uVar6;
    (face->root).descender = sVar14;
    (face->root).height = (uVar6 - sVar14) + sVar5;
    if ((FVar4 != 0xffff) && ((uVar6 == 0 && (sVar14 == 0)))) {
      sVar14 = (face->os2).sTypoAscender;
      if ((sVar14 != 0) || ((face->os2).sTypoDescender != 0)) goto LAB_0024830b;
      uVar7 = (face->os2).usWinAscent;
      (face->root).ascender = uVar7;
      FVar4 = (face->os2).usWinDescent;
      (face->root).descender = -FVar4;
      (face->root).height = FVar4 + uVar7;
    }
  }
  else {
    sVar14 = (face->os2).sTypoAscender;
LAB_0024830b:
    (face->root).ascender = sVar14;
    uVar8 = (face->os2).sTypoDescender;
    (face->root).descender = uVar8;
    (face->root).height = (sVar14 - uVar8) + (face->os2).sTypoLineGap;
  }
  (face->root).max_advance_width = (face->horizontal).advance_Width_Max;
  pFVar24 = &(face->vertical).advance_Height_Max;
  if (face->vertical_info == '\0') {
    pFVar24 = (FT_UShort *)&(face->root).height;
  }
  (face->root).max_advance_height = *pFVar24;
  sVar14 = (face->postscript).underlineThickness;
  iVar20 = *(int *)&(face->postscript).underlinePosition -
           ((int)(short)(sVar14 - (sVar14 >> 0xf)) >> 1);
  (face->root).underline_position = (FT_Short)iVar20;
  (face->root).underline_thickness = sVar14;
LAB_00248389:
  if ((iVar30 != 0x1d) && (iVar30 != 0)) {
    return iVar20;
  }
  return local_a4;
LAB_00247b30:
  uVar15 = (undefined4)CONCAT71((int7)((ulong)pFVar21 >> 8),1);
LAB_002478e6:
  local_98 = (FT_Memory)CONCAT44(local_98._4_4_,uVar15);
  local_a0 = 0;
  goto LAB_0024799c;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  sfnt_load_face( FT_Stream      stream,
                  TT_Face        face,
                  FT_Int         face_instance_index,
                  FT_Int         num_params,
                  FT_Parameter*  params )
  {
    FT_Error  error;
#ifdef TT_CONFIG_OPTION_POSTSCRIPT_NAMES
    FT_Error  psnames_error;
#endif

    FT_Bool  has_outline;
    FT_Bool  is_apple_sbit;

    FT_Bool  has_CBLC;
    FT_Bool  has_CBDT;
    FT_Bool  has_EBLC;
    FT_Bool  has_bloc;
    FT_Bool  has_sbix;

    FT_Bool  ignore_typographic_family    = FALSE;
    FT_Bool  ignore_typographic_subfamily = FALSE;
    FT_Bool  ignore_sbix                  = FALSE;

    SFNT_Service  sfnt = (SFNT_Service)face->sfnt;

    FT_UNUSED( face_instance_index );


    /* Check parameters */

    {
      FT_Int  i;


      for ( i = 0; i < num_params; i++ )
      {
        if ( params[i].tag == FT_PARAM_TAG_IGNORE_TYPOGRAPHIC_FAMILY )
          ignore_typographic_family = TRUE;
        else if ( params[i].tag == FT_PARAM_TAG_IGNORE_TYPOGRAPHIC_SUBFAMILY )
          ignore_typographic_subfamily = TRUE;
        else if ( params[i].tag == FT_PARAM_TAG_IGNORE_SBIX )
          ignore_sbix = TRUE;
      }
    }

    /* Load tables */

    /* We now support two SFNT-based bitmapped font formats.  They */
    /* are recognized easily as they do not include a `glyf'       */
    /* table.                                                      */
    /*                                                             */
    /* The first format comes from Apple, and uses a table named   */
    /* `bhed' instead of `head' to store the font header (using    */
    /* the same format).  It also doesn't include horizontal and   */
    /* vertical metrics tables (i.e. `hhea' and `vhea' tables are  */
    /* missing).                                                   */
    /*                                                             */
    /* The other format comes from Microsoft, and is used with     */
    /* WinCE/PocketPC.  It looks like a standard TTF, except that  */
    /* it doesn't contain outlines.                                */
    /*                                                             */

    FT_TRACE2(( "sfnt_load_face: %p\n", (void *)face ));
    FT_TRACE2(( "\n" ));

    /* do we have outlines in there? */
#ifdef FT_CONFIG_OPTION_INCREMENTAL
    has_outline = FT_BOOL( face->root.internal->incremental_interface ||
                           tt_face_lookup_table( face, TTAG_glyf )    ||
                           tt_face_lookup_table( face, TTAG_CFF )     ||
                           tt_face_lookup_table( face, TTAG_CFF2 )    );
#else
    has_outline = FT_BOOL( tt_face_lookup_table( face, TTAG_glyf ) ||
                           tt_face_lookup_table( face, TTAG_CFF )  ||
                           tt_face_lookup_table( face, TTAG_CFF2 ) );
#endif

    /* check which sbit formats are present */
    has_CBLC = !face->goto_table( face, TTAG_CBLC, stream, 0 );
    has_CBDT = !face->goto_table( face, TTAG_CBDT, stream, 0 );
    has_EBLC = !face->goto_table( face, TTAG_EBLC, stream, 0 );
    has_bloc = !face->goto_table( face, TTAG_bloc, stream, 0 );
    has_sbix = !face->goto_table( face, TTAG_sbix, stream, 0 );

    is_apple_sbit = FALSE;

    if ( ignore_sbix )
      has_sbix = FALSE;

    /* if this font doesn't contain outlines, we try to load */
    /* a `bhed' table                                        */
    if ( !has_outline && sfnt->load_bhed )
    {
      LOAD_( bhed );
      is_apple_sbit = FT_BOOL( !error );
    }

    /* load the font header (`head' table) if this isn't an Apple */
    /* sbit font file                                             */
    if ( !is_apple_sbit || has_sbix )
    {
      LOAD_( head );
      if ( error )
        goto Exit;
    }

    /* Ignore outlines for CBLC/CBDT fonts. */
    if ( has_CBLC || has_CBDT )
      has_outline = FALSE;

    /* OpenType 1.8.2 introduced limits to this value;    */
    /* however, they make sense for older SFNT fonts also */
    if ( face->header.Units_Per_EM <    16 ||
         face->header.Units_Per_EM > 16384 )
    {
      error = FT_THROW( Invalid_Table );

      goto Exit;
    }

    /* the following tables are often not present in embedded TrueType */
    /* fonts within PDF documents, so don't check for them.            */
    LOAD_( maxp );
    LOAD_( cmap );

    /* the following tables are optional in PCL fonts -- */
    /* don't check for errors                            */
    LOAD_( name );
    LOAD_( post );

#ifdef TT_CONFIG_OPTION_POSTSCRIPT_NAMES
    psnames_error = error;
#endif

    /* do not load the metrics headers and tables if this is an Apple */
    /* sbit font file                                                 */
    if ( !is_apple_sbit )
    {
      /* load the `hhea' and `hmtx' tables */
      LOADM_( hhea, 0 );
      if ( !error )
      {
        LOADM_( hmtx, 0 );
        if ( FT_ERR_EQ( error, Table_Missing ) )
        {
          error = FT_THROW( Hmtx_Table_Missing );

#ifdef FT_CONFIG_OPTION_INCREMENTAL
          /* If this is an incrementally loaded font and there are */
          /* overriding metrics, tolerate a missing `hmtx' table.  */
          if ( face->root.internal->incremental_interface          &&
               face->root.internal->incremental_interface->funcs->
                 get_glyph_metrics                                 )
          {
            face->horizontal.number_Of_HMetrics = 0;
            error                               = FT_Err_Ok;
          }
#endif
        }
      }
      else if ( FT_ERR_EQ( error, Table_Missing ) )
      {
        /* No `hhea' table necessary for SFNT Mac fonts. */
        if ( face->format_tag == TTAG_true )
        {
          FT_TRACE2(( "This is an SFNT Mac font.\n" ));

          has_outline = 0;
          error       = FT_Err_Ok;
        }
        else
        {
          error = FT_THROW( Horiz_Header_Missing );

#ifdef FT_CONFIG_OPTION_INCREMENTAL
          /* If this is an incrementally loaded font and there are */
          /* overriding metrics, tolerate a missing `hhea' table.  */
          if ( face->root.internal->incremental_interface          &&
               face->root.internal->incremental_interface->funcs->
                 get_glyph_metrics                                 )
          {
            face->horizontal.number_Of_HMetrics = 0;
            error                               = FT_Err_Ok;
          }
#endif

        }
      }

      if ( error )
        goto Exit;

      /* try to load the `vhea' and `vmtx' tables */
      LOADM_( hhea, 1 );
      if ( !error )
      {
        LOADM_( hmtx, 1 );
        if ( !error )
          face->vertical_info = 1;
      }

      if ( error && FT_ERR_NEQ( error, Table_Missing ) )
        goto Exit;

      LOAD_( os2 );
      if ( error )
      {
        /* we treat the table as missing if there are any errors */
        face->os2.version = 0xFFFFU;
      }
    }

    /* the optional tables */

    /* embedded bitmap support */
    /* TODO: Replace this clumsy check for all possible sbit tables     */
    /*       with something better (for example, by passing a parameter */
    /*       to suppress 'sbix' loading).                               */
    if ( sfnt->load_eblc                                  &&
         ( has_CBLC || has_EBLC || has_bloc || has_sbix ) )
      LOAD_( eblc );

    /* colored glyph support */
    if ( sfnt->load_cpal )
    {
      LOAD_( cpal );
      LOAD_( colr );
    }

    /* OpenType-SVG glyph support */
    if ( sfnt->load_svg )
      LOAD_( svg );

    /* consider the pclt, kerning, and gasp tables as optional */
    LOAD_( pclt );
    LOAD_( gasp );
    LOAD_( kern );

    face->root.num_glyphs = face->max_profile.numGlyphs;

    /* Bit 8 of the `fsSelection' field in the `OS/2' table denotes  */
    /* a WWS-only font face.  `WWS' stands for `weight', width', and */
    /* `slope', a term used by Microsoft's Windows Presentation      */
    /* Foundation (WPF).  This flag has been introduced in version   */
    /* 1.5 of the OpenType specification (May 2008).                 */

    face->root.family_name = NULL;
    face->root.style_name  = NULL;
    if ( face->os2.version != 0xFFFFU && face->os2.fsSelection & 256 )
    {
      if ( !ignore_typographic_family )
        GET_NAME( TYPOGRAPHIC_FAMILY, &face->root.family_name );
      if ( !face->root.family_name )
        GET_NAME( FONT_FAMILY, &face->root.family_name );

      if ( !ignore_typographic_subfamily )
        GET_NAME( TYPOGRAPHIC_SUBFAMILY, &face->root.style_name );
      if ( !face->root.style_name )
        GET_NAME( FONT_SUBFAMILY, &face->root.style_name );
    }
    else
    {
      GET_NAME( WWS_FAMILY, &face->root.family_name );
      if ( !face->root.family_name && !ignore_typographic_family )
        GET_NAME( TYPOGRAPHIC_FAMILY, &face->root.family_name );
      if ( !face->root.family_name )
        GET_NAME( FONT_FAMILY, &face->root.family_name );

      GET_NAME( WWS_SUBFAMILY, &face->root.style_name );
      if ( !face->root.style_name && !ignore_typographic_subfamily )
        GET_NAME( TYPOGRAPHIC_SUBFAMILY, &face->root.style_name );
      if ( !face->root.style_name )
        GET_NAME( FONT_SUBFAMILY, &face->root.style_name );
    }

    /* now set up root fields */
    {
      FT_Face  root  = &face->root;
      FT_Long  flags = root->face_flags;


      /**********************************************************************
       *
       * Compute face flags.
       */
      if ( face->sbit_table_type == TT_SBIT_TABLE_TYPE_CBLC ||
           face->sbit_table_type == TT_SBIT_TABLE_TYPE_SBIX ||
           face->colr                                       ||
           face->svg                                        )
        flags |= FT_FACE_FLAG_COLOR;      /* color glyphs */

      if ( has_outline == TRUE )
      {
        /* by default (and for backward compatibility) we handle */
        /* fonts with an 'sbix' table as bitmap-only             */
        if ( has_sbix )
          flags |= FT_FACE_FLAG_SBIX;     /* with 'sbix' bitmaps */
        else
          flags |= FT_FACE_FLAG_SCALABLE; /* scalable outlines */
      }

      /* The sfnt driver only supports bitmap fonts natively, thus we */
      /* don't set FT_FACE_FLAG_HINTER.                               */
      flags |= FT_FACE_FLAG_SFNT       |  /* SFNT file format  */
               FT_FACE_FLAG_HORIZONTAL;   /* horizontal data   */

#ifdef TT_CONFIG_OPTION_POSTSCRIPT_NAMES
      if ( !psnames_error                             &&
           face->postscript.FormatType != 0x00030000L )
        flags |= FT_FACE_FLAG_GLYPH_NAMES;
#endif

      /* fixed width font? */
      if ( face->postscript.isFixedPitch )
        flags |= FT_FACE_FLAG_FIXED_WIDTH;

      /* vertical information? */
      if ( face->vertical_info )
        flags |= FT_FACE_FLAG_VERTICAL;

      /* kerning available ? */
      if ( TT_FACE_HAS_KERNING( face ) )
        flags |= FT_FACE_FLAG_KERNING;

#ifdef TT_CONFIG_OPTION_GX_VAR_SUPPORT
      /* Don't bother to load the tables unless somebody asks for them. */
      /* No need to do work which will (probably) not be used.          */
      if ( face->variation_support & TT_FACE_FLAG_VAR_FVAR )
        flags |= FT_FACE_FLAG_MULTIPLE_MASTERS;
#endif

      root->face_flags = flags;

      /**********************************************************************
       *
       * Compute style flags.
       */

      flags = 0;
      if ( has_outline == TRUE && face->os2.version != 0xFFFFU )
      {
        /* We have an OS/2 table; use the `fsSelection' field.  Bit 9 */
        /* indicates an oblique font face.  This flag has been        */
        /* introduced in version 1.5 of the OpenType specification.   */

        if ( face->os2.fsSelection & 512 )       /* bit 9 */
          flags |= FT_STYLE_FLAG_ITALIC;
        else if ( face->os2.fsSelection & 1 )    /* bit 0 */
          flags |= FT_STYLE_FLAG_ITALIC;

        if ( face->os2.fsSelection & 32 )        /* bit 5 */
          flags |= FT_STYLE_FLAG_BOLD;
      }
      else
      {
        /* this is an old Mac font, use the header field */

        if ( face->header.Mac_Style & 1 )
          flags |= FT_STYLE_FLAG_BOLD;

        if ( face->header.Mac_Style & 2 )
          flags |= FT_STYLE_FLAG_ITALIC;
      }

      root->style_flags |= flags;

      /**********************************************************************
       *
       * Polish the charmaps.
       *
       *   Try to set the charmap encoding according to the platform &
       *   encoding ID of each charmap.  Emulate Unicode charmap if one
       *   is missing.
       */

      tt_face_build_cmaps( face );  /* ignore errors */


      /* set the encoding fields */
      {
        FT_Int   m;
#ifdef FT_CONFIG_OPTION_POSTSCRIPT_NAMES
        FT_Bool  has_unicode = FALSE;
#endif


        for ( m = 0; m < root->num_charmaps; m++ )
        {
          FT_CharMap  charmap = root->charmaps[m];


          charmap->encoding = sfnt_find_encoding( charmap->platform_id,
                                                  charmap->encoding_id );

#ifdef FT_CONFIG_OPTION_POSTSCRIPT_NAMES

          if ( charmap->encoding == FT_ENCODING_UNICODE   ||
               charmap->encoding == FT_ENCODING_MS_SYMBOL )  /* PUA */
            has_unicode = TRUE;
        }

        /* synthesize Unicode charmap if one is missing */
        if ( !has_unicode                                &&
             root->face_flags & FT_FACE_FLAG_GLYPH_NAMES )
        {
          FT_CharMapRec  cmaprec;


          cmaprec.face        = root;
          cmaprec.platform_id = TT_PLATFORM_MICROSOFT;
          cmaprec.encoding_id = TT_MS_ID_UNICODE_CS;
          cmaprec.encoding    = FT_ENCODING_UNICODE;


          error = FT_CMap_New( (FT_CMap_Class)&tt_cmap_unicode_class_rec,
                               NULL, &cmaprec, NULL );
          if ( error                                      &&
               FT_ERR_NEQ( error, No_Unicode_Glyph_Name ) &&
               FT_ERR_NEQ( error, Unimplemented_Feature ) )
            goto Exit;
          error = FT_Err_Ok;

#endif /* FT_CONFIG_OPTION_POSTSCRIPT_NAMES */

        }
      }

#ifdef TT_CONFIG_OPTION_EMBEDDED_BITMAPS

      /*
       * Now allocate the root array of FT_Bitmap_Size records and
       * populate them.  Unfortunately, it isn't possible to indicate bit
       * depths in the FT_Bitmap_Size record.  This is a design error.
       */
      {
        FT_UInt  count;


        count = face->sbit_num_strikes;

        if ( count > 0 )
        {
          FT_Memory        memory   = face->root.stream->memory;
          FT_UShort        em_size  = face->header.Units_Per_EM;
          FT_Short         avgwidth = face->os2.xAvgCharWidth;
          FT_Size_Metrics  metrics;

          FT_UInt*  sbit_strike_map = NULL;
          FT_UInt   strike_idx, bsize_idx;


          if ( em_size == 0 || face->os2.version == 0xFFFFU )
          {
            avgwidth = 1;
            em_size = 1;
          }

          /* to avoid invalid strike data in the `available_sizes' field */
          /* of `FT_Face', we map `available_sizes' indices to strike    */
          /* indices                                                     */
          if ( FT_NEW_ARRAY( root->available_sizes, count ) ||
               FT_QNEW_ARRAY( sbit_strike_map, count ) )
            goto Exit;

          bsize_idx = 0;
          for ( strike_idx = 0; strike_idx < count; strike_idx++ )
          {
            FT_Bitmap_Size*  bsize = root->available_sizes + bsize_idx;


            error = sfnt->load_strike_metrics( face, strike_idx, &metrics );
            if ( error )
              continue;

            bsize->height = (FT_Short)( metrics.height >> 6 );
            bsize->width  = (FT_Short)(
              ( avgwidth * metrics.x_ppem + em_size / 2 ) / em_size );

            bsize->x_ppem = metrics.x_ppem << 6;
            bsize->y_ppem = metrics.y_ppem << 6;

            /* assume 72dpi */
            bsize->size   = metrics.y_ppem << 6;

            /* only use strikes with valid PPEM values */
            if ( bsize->x_ppem && bsize->y_ppem )
              sbit_strike_map[bsize_idx++] = strike_idx;
          }

          /* reduce array size to the actually used elements */
          FT_MEM_QRENEW_ARRAY( sbit_strike_map, count, bsize_idx );

          /* from now on, all strike indices are mapped */
          /* using `sbit_strike_map'                    */
          if ( bsize_idx )
          {
            face->sbit_strike_map = sbit_strike_map;

            root->face_flags     |= FT_FACE_FLAG_FIXED_SIZES;
            root->num_fixed_sizes = (FT_Int)bsize_idx;
          }
        }
      }

#endif /* TT_CONFIG_OPTION_EMBEDDED_BITMAPS */

      /* a font with no bitmaps and no outlines is scalable; */
      /* it has only empty glyphs then                       */
      if ( !FT_HAS_FIXED_SIZES( root ) && !FT_IS_SCALABLE( root ) )
        root->face_flags |= FT_FACE_FLAG_SCALABLE;


      /**********************************************************************
       *
       * Set up metrics.
       */
      if ( FT_IS_SCALABLE( root ) ||
           FT_HAS_SBIX( root )    )
      {
        /* XXX What about if outline header is missing */
        /*     (e.g. sfnt wrapped bitmap)?             */
        root->bbox.xMin    = face->header.xMin;
        root->bbox.yMin    = face->header.yMin;
        root->bbox.xMax    = face->header.xMax;
        root->bbox.yMax    = face->header.yMax;
        root->units_per_EM = face->header.Units_Per_EM;


        /*
         * Computing the ascender/descender/height is tricky.
         *
         * The OpenType specification v1.8.3 says:
         *
         *   [OS/2's] sTypoAscender, sTypoDescender and sTypoLineGap fields
         *   are intended to allow applications to lay out documents in a
         *   typographically-correct and portable fashion.
         *
         * This is somewhat at odds with the decades of backwards
         * compatibility, operating systems and applications doing whatever
         * they want, not to mention broken fonts.
         *
         * Not all fonts have an OS/2 table; in this case, we take the values
         * in the horizontal header, although there is nothing stopping the
         * values from being unreliable. Even with a OS/2 table, certain fonts
         * set the sTypoAscender, sTypoDescender and sTypoLineGap fields to 0
         * and instead correctly set usWinAscent and usWinDescent.
         *
         * As an example, Arial Narrow is shipped as four files ARIALN.TTF,
         * ARIALNI.TTF, ARIALNB.TTF and ARIALNBI.TTF. Strangely, all fonts have
         * the same values in their sTypo* fields, except ARIALNB.ttf which
         * sets them to 0. All of them have different usWinAscent/Descent
         * values. The OS/2 table therefore cannot be trusted for computing the
         * text height reliably.
         *
         * As a compromise, do the following:
         *
         * 1. If the OS/2 table exists and the fsSelection bit 7 is set
         *    (USE_TYPO_METRICS), trust the font and use the sTypo* metrics.
         * 2. Otherwise, use the `hhea' table's metrics.
         * 3. If they are zero and the OS/2 table exists,
         *    1. use the OS/2 table's sTypo* metrics if they are non-zero.
         *    2. Otherwise, use the OS/2 table's usWin* metrics.
         */

        if ( face->os2.version != 0xFFFFU && face->os2.fsSelection & 128 )
        {
          root->ascender  = face->os2.sTypoAscender;
          root->descender = face->os2.sTypoDescender;
          root->height    = root->ascender - root->descender +
                            face->os2.sTypoLineGap;
        }
        else
        {
          root->ascender  = face->horizontal.Ascender;
          root->descender = face->horizontal.Descender;
          root->height    = root->ascender - root->descender +
                            face->horizontal.Line_Gap;

          if ( !( root->ascender || root->descender ) )
          {
            if ( face->os2.version != 0xFFFFU )
            {
              if ( face->os2.sTypoAscender || face->os2.sTypoDescender )
              {
                root->ascender  = face->os2.sTypoAscender;
                root->descender = face->os2.sTypoDescender;
                root->height    = root->ascender - root->descender +
                                  face->os2.sTypoLineGap;
              }
              else
              {
                root->ascender  =  (FT_Short)face->os2.usWinAscent;
                root->descender = -(FT_Short)face->os2.usWinDescent;
                root->height    =  root->ascender - root->descender;
              }
            }
          }
        }

        root->max_advance_width  =
          (FT_Short)face->horizontal.advance_Width_Max;
        root->max_advance_height =
          (FT_Short)( face->vertical_info ? face->vertical.advance_Height_Max
                                          : root->height );

        /* See https://www.microsoft.com/typography/otspec/post.htm -- */
        /* Adjust underline position from top edge to centre of        */
        /* stroke to convert TrueType meaning to FreeType meaning.     */
        root->underline_position  = face->postscript.underlinePosition -
                                    face->postscript.underlineThickness / 2;
        root->underline_thickness = face->postscript.underlineThickness;
      }

    }

  Exit:
    FT_TRACE2(( "sfnt_load_face: done\n" ));

    return error;
  }